

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  CallReaction reaction_00;
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 extraout_var;
  UntypedFunctionMockerBase *pUVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *local_8e8;
  UntypedFunctionMockerBase *local_8d0;
  ostream *local_8c0;
  ostream *local_8a8;
  UntypedFunctionMockerBase *local_898;
  bool local_889;
  undefined1 *local_880;
  ostream *local_870;
  undefined1 *local_858;
  undefined1 *local_838;
  bool local_81a;
  bool local_819;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_7b0;
  string local_790;
  string local_770 [39];
  byte local_749;
  string local_748 [32];
  UntypedFunctionMockerBase *local_728;
  UntypedActionResultHolderBase *result;
  string local_718 [38];
  bool local_6f2;
  byte local_6f1;
  bool need_to_report_call;
  ExpectationBase *pEStack_6f0;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6d0 [376];
  stringstream local_558 [8];
  stringstream why;
  undefined1 auStack_548 [376];
  stringstream local_3d0 [8];
  stringstream ss;
  ostream aoStack_3c0 [383];
  byte local_241;
  undefined1 local_240 [7];
  bool is_excessive;
  string local_220 [32];
  UntypedFunctionMockerBase *local_200;
  UntypedActionResultHolderBase *result_1;
  stringstream ss_1;
  undefined1 auStack_1e8 [383];
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  bool local_25;
  CallReaction local_24;
  bool need_to_report_uninteresting_call;
  void *pvStack_20;
  CallReaction reaction;
  void *untyped_args_local;
  UntypedFunctionMockerBase *this_local;
  undefined4 extraout_var_00;
  
  pvStack_20 = untyped_args;
  untyped_args_local = this;
  sVar2 = std::
          vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&this->untyped_expectations_);
  if (sVar2 == 0) {
    pvVar3 = MockObject(this);
    local_24 = Mock::GetReactionOnUninterestingCalls(pvVar3);
    if (local_24 == kAllow) {
      local_819 = LogIsVisible(kInfo);
    }
    else {
      if (local_24 == kWarn) {
        local_81a = LogIsVisible(kWarning);
      }
      else {
        local_81a = true;
      }
      local_819 = local_81a;
    }
    pvVar3 = pvStack_20;
    local_25 = local_819;
    if (local_819 == false) {
      pcVar4 = Name(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_69);
      std::operator+(&local_48,"Function call: ",&local_68);
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,&local_48);
      this_local = (UntypedFunctionMockerBase *)CONCAT44(extraout_var,iVar1);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&result_1);
      local_838 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1f8) {
        local_838 = auStack_1e8;
      }
      (*this->_vptr_UntypedFunctionMockerBase[5])(this,pvStack_20,local_838);
      pvVar3 = pvStack_20;
      std::__cxx11::stringstream::str();
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_220);
      pUVar5 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_00,iVar1);
      std::__cxx11::string::~string(local_220);
      local_200 = pUVar5;
      if (pUVar5 != (UntypedFunctionMockerBase *)0x0) {
        local_858 = (undefined1 *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1f8) {
          local_858 = auStack_1e8;
        }
        (*pUVar5->_vptr_UntypedFunctionMockerBase[2])(pUVar5,local_858);
      }
      reaction_00 = local_24;
      std::__cxx11::stringstream::str();
      ReportUninterestingCall(reaction_00,(string *)local_240);
      std::__cxx11::string::~string((string *)local_240);
      this_local = local_200;
      std::__cxx11::stringstream::~stringstream((stringstream *)&result_1);
    }
  }
  else {
    local_241 = 0;
    std::__cxx11::stringstream::stringstream(local_3d0);
    std::__cxx11::stringstream::stringstream(local_558);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_870 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3d0) {
      local_870 = aoStack_3c0;
    }
    local_880 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x558) {
      local_880 = auStack_548;
    }
    iVar1 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,pvStack_20,&untyped_expectation,&local_241,local_870,local_880);
    pEStack_6f0 = (ExpectationBase *)CONCAT44(extraout_var_01,iVar1);
    local_6f1 = pEStack_6f0 != (ExpectationBase *)0x0;
    local_889 = true;
    if (((bool)local_6f1) && (local_889 = true, (local_241 & 1) == 0)) {
      local_889 = LogIsVisible(kInfo);
    }
    pvVar3 = pvStack_20;
    local_6f2 = local_889;
    if (local_889 == false) {
      result._6_1_ = 0;
      result._5_1_ = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::allocator<char>::allocator();
        result._6_1_ = 1;
        std::__cxx11::string::string(local_718,"",(allocator *)((long)&result + 7));
        result._5_1_ = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_718);
        local_898 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_898 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_03,iVar1);
      }
      this_local = local_898;
      if ((result._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_718);
      }
      if ((result._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      }
    }
    else {
      poVar6 = std::operator<<(aoStack_3c0,"    Function call: ");
      pcVar4 = Name(this);
      std::operator<<(poVar6,pcVar4);
      local_8a8 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3d0) {
        local_8a8 = aoStack_3c0;
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,pvStack_20,local_8a8);
      if (((local_6f1 & 1) != 0) && ((local_241 & 1) == 0)) {
        local_8c0 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6e0) {
          local_8c0 = aoStack_6d0;
        }
        ExpectationBase::DescribeLocationTo(pEStack_6f0,local_8c0);
      }
      pvVar3 = pvStack_20;
      local_749 = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::__cxx11::stringstream::str();
        local_749 = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_748);
        local_8d0 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_04,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_8d0 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_05,iVar1);
      }
      if ((local_749 & 1) != 0) {
        std::__cxx11::string::~string(local_748);
      }
      local_728 = local_8d0;
      if (local_8d0 != (UntypedFunctionMockerBase *)0x0) {
        local_8e8 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x3d0) {
          local_8e8 = aoStack_3c0;
        }
        (*local_8d0->_vptr_UntypedFunctionMockerBase[2])(local_8d0,local_8e8);
      }
      poVar6 = std::operator<<(aoStack_3c0,"\n");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar6,local_770);
      std::__cxx11::string::~string(local_770);
      if ((local_6f1 & 1) == 0) {
        std::__cxx11::stringstream::str();
        Expect(false,(char *)0x0,-1,&local_790);
        std::__cxx11::string::~string((string *)&local_790);
      }
      else if ((local_241 & 1) == 0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        std::operator+(&local_7d0,&local_7f0,&local_810);
        Log(kInfo,&local_7d0,2);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_7f0);
      }
      else {
        pcVar4 = ExpectationBase::file(pEStack_6f0);
        iVar1 = ExpectationBase::line(pEStack_6f0);
        std::__cxx11::stringstream::str();
        Expect(false,pcVar4,iVar1,&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
      }
      this_local = local_728;
    }
    result._0_4_ = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_558);
    std::__cxx11::stringstream::~stringstream(local_3d0);
  }
  return (UntypedActionResultHolderBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
                ? LogIsVisible(kWarning)
                :
                // Otherwise, the user wants this to be an error, and we
                // should always print detailed information in the error.
                true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(
          untyped_args, "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != nullptr) result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.
  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(
          untyped_args, &untyped_action, &is_excessive,
          &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, "")
               : this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  UntypedActionResultHolderBase* const result =
      untyped_action == nullptr
          ? this->UntypedPerformDefaultAction(untyped_args, ss.str())
          : this->UntypedPerformAction(untyped_action, untyped_args);
  if (result != nullptr) result->PrintAsActionResult(&ss);
  ss << "\n" << why.str();

  if (!found) {
    // No expectation matches this call - reports a failure.
    Expect(false, nullptr, -1, ss.str());
  } else if (is_excessive) {
    // We had an upper-bound violation and the failure message is in ss.
    Expect(false, untyped_expectation->file(),
           untyped_expectation->line(), ss.str());
  } else {
    // We had an expected call and the matching expectation is
    // described in ss.
    Log(kInfo, loc.str() + ss.str(), 2);
  }

  return result;
}